

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement
          (cmNinjaTargetGenerator *this,cmSourceFile *source,string *config,string *fileConfig,
          bool firstForConfig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  cmMakefile *pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  size_type sVar7;
  __buckets_ptr pp_Var8;
  size_type sVar9;
  pointer pbVar10;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  pointer pbVar15;
  pointer pbVar16;
  pointer pbVar17;
  undefined1 uVar18;
  bool bVar19;
  int iVar20;
  FortranPreprocess FVar21;
  cmGlobalNinjaGenerator *pcVar22;
  string *psVar23;
  cmValue cVar24;
  mapped_type *pmVar25;
  mapped_type *defines;
  mapped_type *includes;
  mapped_type *pmVar26;
  iterator iVar27;
  MapToNinjaPathImpl MVar28;
  cmCustomCommand *pcVar29;
  mapped_type *this_00;
  cmGlobalNinjaGenerator *pcVar30;
  undefined4 extraout_var;
  string *psVar31;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar32;
  cmGeneratorTarget *extraout_RDX;
  cmGeneratorTarget *extraout_RDX_00;
  cmGeneratorTarget *pcVar33;
  uint uVar34;
  string *arch_1;
  pointer pbVar35;
  _Alloc_hider _Var36;
  undefined8 uVar37;
  cmNinjaTargetGenerator *pcVar38;
  undefined7 in_register_00000081;
  long lVar39;
  ulong uVar40;
  string *arch;
  bool bVar41;
  bool bVar42;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_18;
  string_view arg_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar43;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  string_view source_04;
  string_view source_05;
  string_view value;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string dependFileName;
  string sourceDirectoryFlag;
  string objectFileName;
  string objectDir;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchSources;
  string pchSource;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_458;
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  string dyndep;
  string language;
  size_type __dnew;
  size_t local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined4 local_394;
  string ddModmapFile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  string srcpp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depList;
  string ppFileName;
  size_type __dnew_2;
  pointer pbStack_2d0;
  pointer local_2c8;
  string scanRuleName;
  string modmapFormat;
  string objectFileDir;
  string sourceFilePath;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [32];
  _Alloc_hider local_1f0;
  size_type local_1e8;
  char local_1e0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_170;
  cmNinjaDeps local_158;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string cmakeVarLang;
  string cmakeLinkVar;
  
  pcVar38 = (cmNinjaTargetGenerator *)&dependFileName;
  local_394 = (undefined4)CONCAT71(in_register_00000081,firstForConfig);
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  GetCompiledSourceNinjaPath_abi_cxx11_(&sourceFilePath,this,source);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)&pchSources,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  sVar9 = pchSources._M_h._M_bucket_count;
  pp_Var8 = pchSources._M_h._M_buckets;
  pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar22->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&dependFileName,pcVar22,config);
  local_210._0_8_ = sVar9;
  local_210._8_8_ = pp_Var8;
  local_210._16_8_ = dependFileName._M_string_length;
  local_210._24_8_ = dependFileName._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)local_210;
  cmCatViews_abi_cxx11_(&pchSource,views);
  pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  psVar23 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar22,&pchSource);
  objectDir._M_dataplus._M_p = (pointer)&objectDir.field_2;
  pcVar4 = (psVar23->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&objectDir,pcVar4,pcVar4 + psVar23->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
    operator_delete(dependFileName._M_dataplus._M_p,dependFileName.field_2._M_allocated_capacity + 1
                   );
  }
  p_Var2 = &pchSources._M_h._M_before_begin;
  if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
    operator_delete(pchSources._M_h._M_buckets,
                    (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  GetObjectFilePath((string *)local_210,this,source,config);
  pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  psVar23 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar22,(string *)local_210);
  objectFileName._M_dataplus._M_p = (pointer)&objectFileName.field_2;
  pcVar4 = (psVar23->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&objectFileName,pcVar4,pcVar4 + psVar23->_M_string_length);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  local_210._0_8_ = (pointer)0x6;
  local_210._8_8_ = "CMAKE_";
  local_210._16_8_ = language._M_string_length;
  local_210._24_8_ = language._M_dataplus._M_p;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_210;
  cmCatViews_abi_cxx11_(&cmakeVarLang,views_00);
  local_210._0_8_ = cmakeVarLang._M_string_length;
  local_210._8_8_ = cmakeVarLang._M_dataplus._M_p;
  local_210._16_8_ = 0x13;
  local_210._24_8_ = "_RESPONSE_FILE_FLAG";
  views_01._M_len = 2;
  views_01._M_array = (iterator)local_210;
  cmCatViews_abi_cxx11_(&cmakeLinkVar,views_01);
  cVar24 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&cmakeLinkVar);
  iVar20 = std::__cxx11::string::compare((char *)&language);
  if ((iVar20 == 0) ||
     ((iVar20 = std::__cxx11::string::compare((char *)&language), iVar20 == 0 &&
      (cVar24.Value == (string *)0x0)))) {
    uVar34 = 0;
  }
  else {
    bVar41 = ForceResponseFile(this);
    uVar34 = (uint)bVar41;
  }
  LanguageCompilerRule(&local_90,this,&language,config);
  local_1f0._M_p = local_1e0;
  local_210._8_8_ = (char *)0x0;
  local_210._16_8_ = local_210._16_8_ & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    local_1e0[8] = local_90.field_2._M_local_buf[8];
    local_1e0[9] = local_90.field_2._M_local_buf[9];
    local_1e0[10] = local_90.field_2._M_local_buf[10];
    local_1e0[0xb] = local_90.field_2._M_local_buf[0xb];
    local_1e0[0xc] = local_90.field_2._M_local_buf[0xc];
    local_1e0[0xd] = local_90.field_2._M_local_buf[0xd];
    local_1e0[0xe] = local_90.field_2._M_local_buf[0xe];
    local_1e0[0xf] = local_90.field_2._M_local_buf[0xf];
  }
  else {
    local_1f0._M_p = local_90._M_dataplus._M_p;
  }
  local_1e8 = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  p_Var3 = &local_140._M_impl.super__Rb_tree_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210._0_8_ = local_210 + 0x10;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  memset(&local_1d0,0,0x90);
  local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_140._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  ComputeFlagsForObject(&pchSource,this,source,&language,config);
  pchSources._M_h._M_buckets = &p_Var2->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pchSources,"FLAGS","");
  pmVar25 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_140,(key_type *)&pchSources);
  std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSource);
  if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
    operator_delete(pchSources._M_h._M_buckets,
                    (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  ComputeDefines(&pchSource,this,source,&language,config);
  pchSources._M_h._M_buckets = &p_Var2->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pchSources,"DEFINES","");
  pmVar25 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_140,(key_type *)&pchSources);
  std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSource);
  if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
    operator_delete(pchSources._M_h._M_buckets,
                    (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  ComputeIncludes(&pchSource,this,source,&language,config);
  pchSources._M_h._M_buckets = &p_Var2->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pchSources,"INCLUDES","");
  pmVar25 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_140,(key_type *)&pchSources);
  std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSource);
  if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
    operator_delete(pchSources._M_h._M_buckets,
                    (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (this->super_cmCommonTargetGenerator).Makefile;
  pchSource._M_dataplus._M_p = (pointer)0x6;
  pchSource._M_string_length = (long)"The CMAKE_" + 4;
  pchSource.field_2._M_allocated_capacity = language._M_string_length;
  pchSource.field_2._8_8_ = language._M_dataplus._M_p;
  views_02._M_len = 3;
  views_02._M_array = (iterator)&pchSource;
  cmCatViews_abi_cxx11_((string *)&pchSources,views_02);
  psVar23 = cmMakefile::GetSafeDefinition(pcVar5,(string *)&pchSources);
  bVar41 = true;
  if (psVar23->_M_string_length == 4) {
    bVar41 = *(int *)(psVar23->_M_dataplus)._M_p != 0x6376736d;
  }
  if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
    operator_delete(pchSources._M_h._M_buckets,
                    (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if (bVar41) {
    if (language._M_string_length == 0) {
LAB_0040227e:
      pcVar6 = this->LocalGenerator;
      pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      pchSource.field_2._M_allocated_capacity = 2;
      pchSource.field_2._8_8_ = anon_var_dwarf_17e7e34;
      views_06._M_len = 2;
      views_06._M_array = (iterator)&pchSource;
      cmCatViews_abi_cxx11_(&dependFileName,views_06);
      source_01._M_str = dependFileName._M_dataplus._M_p;
      source_01._M_len = dependFileName._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)&pchSources,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source_01,SHELL);
      pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"DEP_FILE","");
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_140,&pchSource);
      std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSources);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
      uVar37 = pchSources._M_h._M_before_begin._M_nxt;
      _Var36._M_p = (pointer)pchSources._M_h._M_buckets;
      if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
LAB_00402363:
        operator_delete(_Var36._M_p,(ulong)((long)&((_Hash_node_base *)uVar37)->_M_nxt + 1));
      }
    }
    else {
      pchSource._M_dataplus._M_p = (pointer)0x6;
      pchSource._M_string_length = (long)"The CMAKE_" + 4;
      pchSource.field_2._M_allocated_capacity = language._M_string_length;
      pchSource.field_2._8_8_ = language._M_dataplus._M_p;
      views_03._M_len = 3;
      views_03._M_array = (iterator)&pchSource;
      cmCatViews_abi_cxx11_((string *)&pchSources,views_03);
      bVar41 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,(string *)&pchSources
                               );
      if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
        operator_delete(pchSources._M_h._M_buckets,
                        (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
      }
      if (!bVar41) goto LAB_0040227e;
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&pchSources,&objectFileName);
      pchSource._M_dataplus._M_p = (pointer)pchSources._M_h._M_bucket_count;
      pchSource._M_string_length = (size_type)pchSources._M_h._M_buckets;
      pchSource.field_2._M_allocated_capacity = 2;
      pchSource.field_2._8_8_ = anon_var_dwarf_17e7e34;
      views_04._M_len = 2;
      views_04._M_array = (iterator)&pchSource;
      cmCatViews_abi_cxx11_(&dependFileName,views_04);
      if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
        operator_delete(pchSources._M_h._M_buckets,
                        (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
      }
      pcVar6 = this->LocalGenerator;
      pchSources._M_h._M_buckets = (__buckets_ptr)0x1;
      pchSources._M_h._M_before_begin._M_nxt._0_1_ = 0x2f;
      pchSource._M_dataplus._M_p = (pointer)objectFileDir._M_string_length;
      pchSource._M_string_length = (size_type)objectFileDir._M_dataplus._M_p;
      pchSource.field_2._M_allocated_capacity = 1;
      views_05._M_len = 3;
      views_05._M_array = (iterator)&pchSource;
      pchSources._M_h._M_bucket_count = (size_type)p_Var2;
      pchSource.field_2._8_8_ = p_Var2;
      cmCatViews_abi_cxx11_(&sourceDirectoryFlag,views_05);
      source_00._M_str = sourceDirectoryFlag._M_dataplus._M_p;
      source_00._M_len = sourceDirectoryFlag._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&dyndep,&(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,source_00,SHELL);
      pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"DEP_FILE","");
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_140,&pchSource);
      std::__cxx11::string::operator=((string *)pmVar25,(string *)&dyndep);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dyndep._M_dataplus._M_p != &dyndep.field_2) {
        operator_delete(dyndep._M_dataplus._M_p,dyndep.field_2._M_allocated_capacity + 1);
      }
      uVar37 = sourceDirectoryFlag.field_2._M_allocated_capacity;
      _Var36._M_p = sourceDirectoryFlag._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2)
      goto LAB_00402363;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_394 != '\0') {
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"FLAGS","");
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_140,&pchSource);
    pchSources._M_h._M_buckets = &p_Var2->_M_nxt;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pchSources,"DEFINES","");
    defines = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_140,(key_type *)&pchSources);
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"INCLUDES","");
    includes = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_140,&dependFileName);
    ExportObjectCompileCommand
              (this,&language,&sourceFilePath,&objectDir,&objectFileName,&objectFileDir,pmVar25,
               defines,includes,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    if ((__node_base *)pchSources._M_h._M_buckets != p_Var2) {
      operator_delete(pchSources._M_h._M_buckets,
                      (ulong)((long)&(pchSources._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1d0,&objectFileName);
  if ((char)local_394 != '\0') {
    pcVar5 = (this->super_cmCommonTargetGenerator).Makefile;
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"CMAKE_PCH_EXTENSION","");
    cVar24 = cmMakefile::GetDefinition(pcVar5,&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
    pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
    if (cVar24.Value != (string *)0x0) {
      uVar40 = (cVar24.Value)->_M_string_length;
      if ((uVar40 <= objectFileName._M_string_length) &&
         (__str._M_str = ((cVar24.Value)->_M_dataplus)._M_p, __str._M_len = uVar40,
         iVar20 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&pchSource,
                             objectFileName._M_string_length - uVar40,uVar40,__str), iVar20 == 0))
      goto LAB_004025ac;
    }
    pmVar26 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](&this->Configs,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pmVar26->Objects,&objectFileName);
  }
LAB_004025ac:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_188,&sourceFilePath);
  depList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmGeneratorTarget::GetAppleArchs
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,&architectures);
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&architectures);
  }
  pbVar10 = architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pchSources._M_h._M_buckets = &pchSources._M_h._M_single_bucket;
  pchSources._M_h._M_bucket_count = 1;
  pchSources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pchSources._M_h._M_element_count = 0;
  pchSources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pchSources._M_h._M_rehash_policy._M_next_resize = 0;
  pchSources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar35 = architectures.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmGeneratorTarget::GetPchSource
                (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,&language,
                 pbVar35);
      if (pchSource._M_string_length != 0) {
        dependFileName._M_dataplus._M_p = (pointer)&pchSources;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pchSources,&pchSource,&dependFileName);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
      pbVar35 = pbVar35 + 1;
    } while (pbVar35 != pbVar10);
    if (pchSources._M_h._M_element_count != 0) {
      pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&pchSource,"SKIP_PRECOMPILE_HEADERS","");
      cVar24 = cmSourceFile::GetProperty(source,&pchSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
      pbVar10 = architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((cVar24.Value == (string *)0x0) &&
         (architectures.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          architectures.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        pbVar35 = architectures.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          cmGeneratorTarget::GetPchHeader
                    (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
                     &language,pbVar35);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depList,
                     &pchSource);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
            operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
          }
          psVar23 = cmSourceFile::GetFullPath_abi_cxx11_(source);
          iVar27 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(&pchSources._M_h,psVar23);
          if (iVar27.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            cmGeneratorTarget::GetPchFile
                      (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
                       &language,pbVar35);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depList
                       ,&pchSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
              operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pbVar35 = pbVar35 + 1;
        } while (pbVar35 != pbVar10);
      }
    }
  }
  pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"OBJECT_DEPENDS","");
  cVar24 = cmSourceFile::GetProperty(source,&pchSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  if (cVar24.Value != (string *)0x0) {
    arg._M_str = ((cVar24.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar24.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pchSource,arg,false);
    lVar39 = (long)(pchSource._M_string_length - (long)pchSource._M_dataplus._M_p) >> 5;
    if (0 < lVar39) {
      uVar40 = lVar39 + 1;
      _Var36 = pchSource._M_dataplus;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depList,(value_type *)_Var36._M_p);
        _Var36._M_p = _Var36._M_p + 0x20;
        uVar40 = uVar40 - 1;
      } while (1 < uVar40);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pchSource);
  }
  pbVar10 = depList.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (depList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      depList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar35 = depList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar41 = cmsys::SystemTools::FileIsFullPath(pbVar35);
      if (bVar41) {
        cmsys::SystemTools::CollapseFullPath(&pchSource,pbVar35);
        std::__cxx11::string::operator=((string *)pbVar35,(string *)&pchSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
          operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar12 = depList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar11 = depList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar35 = pbVar35 + 1;
    } while (pbVar35 != pbVar10);
    MVar28.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar11,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar12,&vStack_170,MVar28);
  }
  pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar22->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
            (&pchSource,pcVar22,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
             &pchSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  bVar41 = cmSourceFile::GetIsGenerated(source,GlobalAndLocal);
  if (bVar41) {
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pchSource,"__CMAKE_GENERATED_BY_CMAKE","");
    bVar41 = cmSourceFile::GetPropertyAsBool(source,&pchSource);
    if ((bVar41) ||
       (pcVar29 = cmSourceFile::GetCustomCommand(source), pcVar29 != (cmCustomCommand *)0x0)) {
      bVar41 = false;
    }
    else {
      pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar32 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar22->CustomCommandOutputs)._M_t,&sourceFilePath);
      bVar41 = (_Rb_tree_header *)iVar32._M_node ==
               &(pcVar22->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    if (bVar41) {
      pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmGlobalNinjaGenerator::AddAssumedSourceDependencies(pcVar22,&sourceFilePath,&local_158);
    }
  }
  bVar41 = NeedDyndep(this,&language,config);
  iVar20 = std::__cxx11::string::compare((char *)&language);
  modmapFormat._M_dataplus._M_p = (pointer)&modmapFormat.field_2;
  modmapFormat._M_string_length = 0;
  modmapFormat.field_2._M_local_buf[0] = '\0';
  if (bVar41) {
    pchSource._M_dataplus._M_p = (pointer)0x13;
    pchSource._M_string_length = (size_type)anon_var_dwarf_17e796b;
    pchSource.field_2._M_allocated_capacity = language._M_string_length;
    pchSource.field_2._8_8_ = language._M_dataplus._M_p;
    views_07._M_len = 3;
    views_07._M_array = (iterator)&pchSource;
    cmCatViews_abi_cxx11_(&dependFileName,views_07);
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,&dependFileName);
    std::__cxx11::string::_M_assign((string *)&modmapFormat);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"Fortran_PREPROCESS","");
    psVar23 = cmSourceFile::GetSafeProperty(source,&pchSource);
    srcpp._M_dataplus._M_p = (pointer)&srcpp.field_2;
    pcVar4 = (psVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&srcpp,pcVar4,pcVar4 + psVar23->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    value._M_str = srcpp._M_dataplus._M_p;
    value._M_len = srcpp._M_string_length;
    FVar21 = cmOutputConverter::GetFortranPreprocess(value);
    if (FVar21 == Unset) {
      pcVar33 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"Fortran_PREPROCESS","");
      psVar23 = cmGeneratorTarget::GetSafeProperty(pcVar33,&pchSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
      value_00._M_str = (psVar23->_M_dataplus)._M_p;
      value_00._M_len = psVar23->_M_string_length;
      FVar21 = cmOutputConverter::GetFortranPreprocess(value_00);
    }
    bVar41 = iVar20 == 0;
    bVar42 = FVar21 != NotNeeded;
    if (bVar42 && bVar41) {
      bVar19 = CompileWithDefines(this,&language);
      uVar37 = dependFileName.field_2._8_8_;
      dependFileName.field_2._M_local_buf[10] = '\0';
      scanRuleName._M_dataplus._M_p = (pointer)&scanRuleName.field_2;
      scanRuleName._M_string_length = 0;
      scanRuleName.field_2._M_local_buf[0] = '\0';
      ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
      ppFileName._M_string_length = 0;
      ppFileName.field_2._M_local_buf[0] = '\0';
      LanguagePreprocessAndScanRule(&pchSource,this,&language,config);
      dependFileName.field_2._8_8_ = uVar37;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      std::__cxx11::string::operator=((string *)&scanRuleName,(string *)&pchSource);
      dependFileName.field_2._M_local_buf[10] = uVar18;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
        dependFileName.field_2._M_local_buf[10] = uVar18;
        uVar18 = dependFileName.field_2._M_local_buf[10];
      }
      dependFileName.field_2._M_local_buf[10] = uVar18;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      GetPreprocessedFilePath(&pchSource,this,source,config);
      dependFileName.field_2._M_local_buf[10] = uVar18;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      dependFileName.field_2._M_local_buf[10] = uVar18;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar22,&pchSource);
      dependFileName.field_2._M_local_buf[10] = uVar18;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      std::__cxx11::string::_M_assign((string *)&ppFileName);
      dependFileName.field_2._M_local_buf[10] = uVar18;
      uVar18 = dependFileName.field_2._M_local_buf[10];
      uVar37 = dependFileName.field_2._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
        dependFileName.field_2._M_local_buf[10] = uVar18;
        uVar18 = dependFileName.field_2._M_local_buf[10];
        uVar37 = dependFileName.field_2._8_8_;
      }
    }
    else {
      scanRuleName._M_dataplus._M_p = (pointer)&scanRuleName.field_2;
      scanRuleName._M_string_length = 0;
      scanRuleName.field_2._M_local_buf[0] = '\0';
      ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
      ppFileName._M_string_length = 0;
      ppFileName.field_2._M_local_buf[0] = '\0';
      LanguageScanRule(&pchSource,this,&language,config);
      std::__cxx11::string::operator=((string *)&scanRuleName,(string *)&pchSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
      pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      pchSource.field_2._M_allocated_capacity = 6;
      pchSource.field_2._8_8_ = anon_var_dwarf_17e7e75;
      views_08._M_len = 2;
      views_08._M_array = (iterator)&pchSource;
      cmCatViews_abi_cxx11_(&dependFileName,views_08);
      std::__cxx11::string::operator=((string *)&ppFileName,(string *)&dependFileName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      uVar37 = dependFileName.field_2._8_8_;
      dependFileName.field_2._M_local_buf[10] = '\0';
      bVar19 = false;
      uVar18 = dependFileName.field_2._M_local_buf[10];
    }
    dependFileName.field_2._M_local_buf[10] = uVar18;
    dependFileName.field_2._8_8_ = uVar37;
    uVar18 = dependFileName.field_2._M_local_buf[10];
    local_368 = &scanRuleName.field_2;
    local_370 = &ppFileName.field_2;
    pcVar6 = this->LocalGenerator;
    dyndep._M_dataplus._M_p = (pointer)&dyndep.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dyndep,scanRuleName._M_dataplus._M_p,
               scanRuleName._M_dataplus._M_p + scanRuleName._M_string_length);
    dependFileName.field_2._M_local_buf[10] = uVar18;
    uVar18 = dependFileName.field_2._M_local_buf[10];
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    pchSource._M_string_length = 0;
    pchSource.field_2._M_allocated_capacity =
         pchSource.field_2._M_allocated_capacity & 0xffffffffffffff00;
    dyndep._M_string_length = 0;
    dyndep.field_2._M_allocated_capacity = dyndep.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    p_Var3 = &local_458._M_t._M_impl.super__Rb_tree_header;
    local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dyndep._M_dataplus._M_p = (pointer)&dyndep.field_2;
    memset(&local_4e8,0,0x90);
    dependFileName.field_2._M_local_buf[10] = uVar18;
    uVar18 = dependFileName.field_2._M_local_buf[10];
    uVar37 = dependFileName.field_2._8_8_;
    dependFileName.field_2._M_local_buf[10] = uVar18;
    local_458._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_428._M_p = (pointer)&local_418;
    local_420 = 0;
    local_418._M_local_buf[0] = '\0';
    local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    dependFileName.field_2._M_local_buf[7] = dependFileName.field_2._M_local_buf[10];
    std::__cxx11::string::_M_replace((ulong)&local_428,0,(char *)0x0,0x781ce4);
    dependFileName.field_2._8_8_ = uVar37;
    pbVar17 = local_470.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar16 = local_470.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar15 = local_470.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = vStack_488.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar13 = vStack_488.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar12 = vStack_488.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = local_4a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar35 = local_4a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = local_4a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (bVar42 && bVar41) {
      local_4a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_4a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar10;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar35;
      local_4a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vStack_170.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
      vStack_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar12;
      vStack_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_170.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      vStack_488.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_170.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
      vStack_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar14;
      local_470.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_470.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_470.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar15;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar16;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar17;
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      dependFileName._M_string_length = 6;
      dependFileName.field_2._M_allocated_capacity =
           CONCAT17(dependFileName.field_2._M_local_buf[7],0x5342415f4e49);
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_458,&dependFileName);
      sourceDirectoryFlag._M_string_length = 6;
      sourceDirectoryFlag.field_2._M_allocated_capacity._0_7_ = 0x5342415f4e49;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_140,&sourceDirectoryFlag);
      std::__cxx11::string::swap((string *)pmVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_188,&ppFileName);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_4a0,&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&vStack_488,&vStack_170);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_470,&local_158);
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      dependFileName._M_string_length = 6;
      dependFileName.field_2._M_allocated_capacity =
           CONCAT17(dependFileName.field_2._M_local_buf[7],0x5342415f4e49);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_140,&dependFileName);
      sourceDirectoryFlag._M_string_length = 6;
      sourceDirectoryFlag.field_2._M_allocated_capacity._0_7_ = 0x5342415f4e49;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)&sourceDirectoryFlag.field_2;
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_458,&sourceDirectoryFlag);
      std::__cxx11::string::_M_assign((string *)pmVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
    }
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    dependFileName.field_2._M_allocated_capacity =
         CONCAT26((short)((ulong)dependFileName.field_2._0_8_ >> 0x30),0x5347414c46);
    dependFileName._M_string_length = 5;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_140,&dependFileName);
    paVar1 = &sourceDirectoryFlag.field_2;
    sourceDirectoryFlag.field_2._M_allocated_capacity._0_6_ = 0x5347414c46;
    sourceDirectoryFlag._M_string_length = 5;
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_458,&sourceDirectoryFlag);
    std::__cxx11::string::_M_assign((string *)pmVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    if (bVar19 == false && (bVar42 && bVar41)) {
      dependFileName._M_string_length = 7;
      dependFileName.field_2._M_allocated_capacity = 0x53454e49464544;
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_458,&dependFileName);
      sourceDirectoryFlag._M_string_length = 7;
      sourceDirectoryFlag.field_2._M_allocated_capacity = 0x53454e49464544;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_140,&sourceDirectoryFlag);
      std::__cxx11::string::swap((string *)pmVar25);
    }
    else {
      dependFileName._M_string_length = 7;
      dependFileName.field_2._M_allocated_capacity = 0x53454e49464544;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_140,&dependFileName);
      sourceDirectoryFlag._M_string_length = 7;
      sourceDirectoryFlag.field_2._M_allocated_capacity = 0x53454e49464544;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_458,&sourceDirectoryFlag);
      std::__cxx11::string::_M_assign((string *)pmVar25);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    dependFileName.field_2._M_allocated_capacity = 0x534544554c434e49;
    dependFileName._M_string_length = 8;
    dependFileName.field_2._8_8_ = dependFileName.field_2._8_8_ & 0xffffffffffffff00;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_140,&dependFileName);
    sourceDirectoryFlag.field_2._M_allocated_capacity = 0x534544554c434e49;
    sourceDirectoryFlag._M_string_length = 8;
    sourceDirectoryFlag.field_2._M_local_buf[8] = '\0';
    sourceDirectoryFlag._M_dataplus._M_p = (pointer)paVar1;
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_458,&sourceDirectoryFlag);
    std::__cxx11::string::_M_assign((string *)pmVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != paVar1) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    dependFileName.field_2._M_allocated_capacity = 0x454c49465f4a424f;
    dependFileName._M_string_length = 8;
    dependFileName.field_2._8_8_ = dependFileName.field_2._8_8_ & 0xffffffffffffff00;
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_458,&dependFileName);
    std::__cxx11::string::_M_assign((string *)pmVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    dependFileName._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
    dependFileName._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
    dependFileName.field_2._M_allocated_capacity = 4;
    views_09._M_len = 2;
    views_09._M_array = (iterator)&dependFileName;
    dependFileName.field_2._8_8_ = ".ddi";
    cmCatViews_abi_cxx11_(&sourceDirectoryFlag,views_09);
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    __dnew = 0x18;
    dependFileName._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&dependFileName,(ulong)&__dnew);
    dependFileName.field_2._M_allocated_capacity = __dnew;
    builtin_strncpy(dependFileName._M_dataplus._M_p,"DYNDEP_INTERMEDIATE_FILE",0x18);
    dependFileName._M_string_length = __dnew;
    dependFileName._M_dataplus._M_p[__dnew] = '\0';
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_458,&dependFileName);
    std::__cxx11::string::_M_assign((string *)pmVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    if (bVar42 && bVar41) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4e8,&ppFileName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_4d0,&sourceDirectoryFlag);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4e8,&sourceDirectoryFlag);
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      __dnew = 0x18;
      dependFileName._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&dependFileName,(ulong)&__dnew);
      dependFileName.field_2._M_allocated_capacity = __dnew;
      builtin_strncpy(dependFileName._M_dataplus._M_p,"PREPROCESSED_OUTPUT_FILE",0x18);
      dependFileName._M_string_length = __dnew;
      dependFileName._M_dataplus._M_p[__dnew] = '\0';
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_458,&dependFileName);
      std::__cxx11::string::_M_assign((string *)pmVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
    }
    dependFileName._M_string_length =
         (size_type)
         ((local_4e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    dependFileName._M_dataplus._M_p =
         (pointer)(local_4e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    dependFileName.field_2._M_allocated_capacity = 2;
    views_10._M_len = 2;
    views_10._M_array = (iterator)&dependFileName;
    dependFileName.field_2._8_8_ = ".d";
    cmCatViews_abi_cxx11_((string *)&__dnew,views_10);
    source_02._M_str = (char *)__dnew;
    source_02._M_len = local_3b0;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&dependFileName,
               &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_02,SHELL);
    paVar1 = &ddModmapFile.field_2;
    ddModmapFile.field_2._M_allocated_capacity = 0x454c49465f504544;
    ddModmapFile._M_string_length = 8;
    ddModmapFile.field_2._M_local_buf[8] = '\0';
    ddModmapFile._M_dataplus._M_p = (pointer)paVar1;
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_458,&ddModmapFile);
    std::__cxx11::string::operator=((string *)pmVar25,(string *)&dependFileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ddModmapFile._M_dataplus._M_p != paVar1) {
      operator_delete(ddModmapFile._M_dataplus._M_p,ddModmapFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    if (bVar42 && bVar41) {
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      dependFileName.field_2._M_allocated_capacity = 0x454c49465f504544;
      dependFileName._M_string_length = 8;
      dependFileName.field_2._8_8_ = dependFileName.field_2._8_8_ & 0xffffffffffffff00;
      pVar43 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&local_140,&dependFileName);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&local_140,(_Base_ptr)pVar43.first._M_node,(_Base_ptr)pVar43.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
    }
    if (modmapFormat._M_string_length != 0) {
      dependFileName._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      dependFileName._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      dependFileName.field_2._M_allocated_capacity = 7;
      views_11._M_len = 2;
      views_11._M_array = (iterator)&dependFileName;
      dependFileName.field_2._8_8_ = ".modmap";
      cmCatViews_abi_cxx11_(&ddModmapFile,views_11);
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      __dnew_2 = 0x16;
      dependFileName._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&dependFileName,(ulong)&__dnew_2);
      dependFileName.field_2._M_allocated_capacity = __dnew_2;
      builtin_strncpy(dependFileName._M_dataplus._M_p,"DYNDEP_MODULE_MAP_FILE",0x16);
      dependFileName._M_string_length = __dnew_2;
      dependFileName._M_dataplus._M_p[__dnew_2] = '\0';
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_458,&dependFileName);
      std::__cxx11::string::_M_assign((string *)pmVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_4d0,&ddModmapFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ddModmapFile._M_dataplus._M_p != paVar1) {
        operator_delete(ddModmapFile._M_dataplus._M_p,ddModmapFile.field_2._M_allocated_capacity + 1
                       );
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_3a8) {
      operator_delete((void *)__dnew,local_3a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if (bVar42 && bVar41) {
      pcVar5 = (this->super_cmCommonTargetGenerator).Makefile;
      dependFileName._M_dataplus._M_p = (pointer)0x6;
      dependFileName._M_string_length = (long)"The CMAKE_" + 4;
      dependFileName.field_2._M_allocated_capacity = language._M_string_length;
      views_12._M_len = 3;
      views_12._M_array = (iterator)&dependFileName;
      cmCatViews_abi_cxx11_(&dyndep,views_12);
      psVar23 = cmMakefile::GetSafeDefinition(pcVar5,&dyndep);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dyndep._M_dataplus._M_p != &dyndep.field_2) {
        operator_delete(dyndep._M_dataplus._M_p,dyndep.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = this->LocalGenerator;
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"FLAGS","");
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_140,&dependFileName);
      (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar6,pmVar25,psVar23);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      __dnew_2 = 0;
      pbStack_2d0 = (pointer)0x0;
      local_2c8 = (pointer)0x0;
      psVar23 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory(&dependFileName,psVar23);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__dnew_2,
                 &dependFileName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::GetIncludeFlags
                (&sourceDirectoryFlag,(cmLocalGenerator *)this->LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__dnew_2,(this->super_cmCommonTargetGenerator).GeneratorTarget,&language,config
                 ,false);
      sVar7 = sourceDirectoryFlag._M_string_length;
      _Var36 = sourceDirectoryFlag._M_dataplus;
      dyndep._M_dataplus._M_p = (pointer)0x1;
      dyndep._M_string_length = (size_type)&dyndep.field_2;
      dyndep.field_2._M_local_buf[0] = 0x20;
      ddModmapFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ddModmapFile,"INCLUDES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_140,&ddModmapFile);
      dependFileName._M_dataplus._M_p = (pointer)sVar7;
      dependFileName._M_string_length = (size_type)_Var36._M_p;
      dependFileName.field_2._M_allocated_capacity = (size_type)dyndep._M_dataplus._M_p;
      dependFileName.field_2._8_8_ = dyndep._M_string_length;
      views_13._M_len = 3;
      views_13._M_array = (iterator)&dependFileName;
      cmCatViews_abi_cxx11_((string *)&__dnew,views_13);
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"INCLUDES","");
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_140,&dependFileName);
      std::__cxx11::string::operator=((string *)pmVar25,(string *)&__dnew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != &local_3a8) {
        operator_delete((void *)__dnew,local_3a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ddModmapFile._M_dataplus._M_p != paVar1) {
        operator_delete(ddModmapFile._M_dataplus._M_p,ddModmapFile.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__dnew_2);
    }
    if ((char)local_394 != '\0') {
      dependFileName._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      dependFileName._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      dependFileName.field_2._M_allocated_capacity = 4;
      views_14._M_len = 2;
      views_14._M_array = (iterator)&dependFileName;
      dependFileName.field_2._8_8_ = ".ddi";
      cmCatViews_abi_cxx11_(&dyndep,views_14);
      pmVar26 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                ::operator[](&this->Configs,config);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&pmVar26->DDIFiles,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&dyndep);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dyndep._M_dataplus._M_p != &dyndep.field_2) {
        operator_delete(dyndep._M_dataplus._M_p,dyndep.field_2._M_allocated_capacity + 1);
      }
    }
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"JOB_POOL_COMPILE","")
    ;
    addPoolNinjaVariable
              (pcVar38,&dependFileName,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar30 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    iVar20 = (*(pcVar30->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[0x41])(pcVar30,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar22,(ostream *)CONCAT44(extraout_var,iVar20),(cmNinjaBuild *)&pchSource,-uVar34,
               (bool *)0x0);
    GetDyndepFilePath(&dyndep,this,&language,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_158,&dyndep);
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"dyndep","");
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_140,&dependFileName);
    std::__cxx11::string::_M_assign((string *)pmVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    if (modmapFormat._M_string_length != 0) {
      dependFileName._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      dependFileName._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      dependFileName.field_2._M_allocated_capacity = 7;
      views_15._M_len = 2;
      views_15._M_array = (iterator)&dependFileName;
      dependFileName.field_2._8_8_ = ".modmap";
      cmCatViews_abi_cxx11_(&sourceDirectoryFlag,views_15);
      dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dependFileName,"DYNDEP_MODULE_MAP_FILE","");
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_140,&dependFileName);
      std::__cxx11::string::_M_assign((string *)pmVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
        operator_delete(dependFileName._M_dataplus._M_p,
                        dependFileName.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_158,&sourceDirectoryFlag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
        operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                        sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dyndep._M_dataplus._M_p != &dyndep.field_2) {
      operator_delete(dyndep._M_dataplus._M_p,dyndep.field_2._M_allocated_capacity + 1);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppFileName._M_dataplus._M_p != local_370) {
      operator_delete(ppFileName._M_dataplus._M_p,
                      CONCAT71(ppFileName.field_2._M_allocated_capacity._1_7_,
                               ppFileName.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)scanRuleName._M_dataplus._M_p != local_368) {
      operator_delete(scanRuleName._M_dataplus._M_p,
                      CONCAT71(scanRuleName.field_2._M_allocated_capacity._1_7_,
                               scanRuleName.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)srcpp._M_dataplus._M_p != &srcpp.field_2) {
      operator_delete(srcpp._M_dataplus._M_p,srcpp.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureParentDirectoryExists(this,&objectFileName);
  source_03._M_str = objectDir._M_dataplus._M_p;
  source_03._M_len = objectDir._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&pchSource,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,source_03,SHELL);
  dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"OBJECT_DIR","");
  pmVar25 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_140,&dependFileName);
  std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
    operator_delete(dependFileName._M_dataplus._M_p,dependFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  source_04._M_str = objectFileDir._M_dataplus._M_p;
  source_04._M_len = objectFileDir._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&pchSource,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,source_04,SHELL);
  dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"OBJECT_FILE_DIR","");
  pmVar25 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_140,&dependFileName);
  std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
    operator_delete(dependFileName._M_dataplus._M_p,dependFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  pcVar38 = (cmNinjaTargetGenerator *)&pchSource;
  pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar38,"JOB_POOL_COMPILE","");
  addPoolNinjaVariable
            (pcVar38,&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (cmNinjaVars *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  if (pchSources._M_h._M_element_count != 0) {
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pchSource,"SKIP_PRECOMPILE_HEADERS","");
    cVar24 = cmSourceFile::GetProperty(source,&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    if (cVar24.Value == (string *)0x0) {
      psVar23 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      iVar27 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&pchSources._M_h,psVar23);
      if (iVar27.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pcVar38 = (cmNinjaTargetGenerator *)&pchSource;
        pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pcVar38,"JOB_POOL_PRECOMPILE_HEADER","");
        addPoolNinjaVariable
                  (pcVar38,&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmNinjaVars *)&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
          operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  SetMsvcTargetPdbVariable(this,(cmNinjaVars *)&local_140,config);
  pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
  pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
  pchSource.field_2._M_allocated_capacity = 4;
  pchSource.field_2._8_8_ = (long)"deviceLinkLibs.rsp" + 0xe;
  views_16._M_len = 2;
  views_16._M_array = (iterator)&pchSource;
  cmCatViews_abi_cxx11_(&dependFileName,views_16);
  std::__cxx11::string::operator=((string *)&local_110,(string *)&dependFileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
    operator_delete(dependFileName._M_dataplus._M_p,dependFileName.field_2._M_allocated_capacity + 1
                   );
  }
  iVar20 = std::__cxx11::string::compare((char *)&language);
  if (iVar20 == 0) {
    psVar23 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&dyndep,psVar23);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&pchSource,&dyndep);
    std::__cxx11::string::operator=((string *)&dyndep,(string *)&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    pcVar33 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"ISPC_HEADER_SUFFIX","");
    cVar24 = cmGeneratorTarget::GetProperty(pcVar33,&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    if (cVar24.Value == (string *)0x0) {
      __assert_fail("ispcSuffixProp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                    ,0x613,
                    "void cmNinjaTargetGenerator::WriteObjectBuildStatement(const cmSourceFile *, const std::string &, const std::string &, bool)"
                   );
    }
    cmGeneratorTarget::GetObjectDirectory
              (&sourceDirectoryFlag,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
    pcVar33 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"ISPC_HEADER_DIRECTORY","")
    ;
    cVar24 = cmGeneratorTarget::GetProperty(pcVar33,&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    if (cVar24.Value != (string *)0x0) {
      psVar31 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)this->LocalGenerator);
      pchSource._M_string_length = (size_type)(psVar31->_M_dataplus)._M_p;
      pchSource._M_dataplus._M_p = (pointer)psVar31->_M_string_length;
      dependFileName._M_dataplus._M_p = (pointer)0x1;
      dependFileName._M_string_length = (size_type)&dependFileName.field_2;
      dependFileName.field_2._M_allocated_capacity =
           CONCAT71((int7)((ulong)dependFileName.field_2._0_8_ >> 8),0x2f);
      pchSource.field_2._M_allocated_capacity = 1;
      views_17._M_len = 3;
      views_17._M_array = (iterator)&pchSource;
      pchSource.field_2._8_8_ = dependFileName._M_string_length;
      cmCatViews_abi_cxx11_((string *)&__dnew,views_17);
      std::__cxx11::string::operator=((string *)&sourceDirectoryFlag,(string *)&__dnew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != &local_3a8) {
        operator_delete((void *)__dnew,local_3a8._M_allocated_capacity + 1);
      }
    }
    dependFileName._M_dataplus._M_p = (pointer)0x1;
    dependFileName._M_string_length = (size_type)&dependFileName.field_2;
    dependFileName.field_2._M_allocated_capacity =
         CONCAT71((int7)((ulong)dependFileName.field_2._0_8_ >> 8),0x2f);
    pchSource._M_dataplus._M_p = (pointer)sourceDirectoryFlag._M_string_length;
    pchSource._M_string_length = (size_type)sourceDirectoryFlag._M_dataplus._M_p;
    pchSource.field_2._M_allocated_capacity = 1;
    views_18._M_len = 4;
    views_18._M_array = (iterator)&pchSource;
    pchSource.field_2._8_8_ = dependFileName._M_string_length;
    cmCatViews_abi_cxx11_((string *)&__dnew,views_18);
    pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar22,(string *)&__dnew);
    std::__cxx11::string::_M_assign((string *)&__dnew);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_1b8,(value_type *)&__dnew);
    pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,__dnew,local_3b0 + __dnew);
    cmGlobalNinjaGenerator::AddAdditionalCleanFile(pcVar22,&local_b0,config);
    pcVar33 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      pcVar33 = extraout_RDX_00;
    }
    detail::ComputeISPCObjectSuffixes_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ddModmapFile,(detail *)(this->super_cmCommonTargetGenerator).GeneratorTarget,
               pcVar33);
    if (0x20 < ddModmapFile._M_string_length - (long)ddModmapFile._M_dataplus._M_p) {
      cmGeneratorTarget::GetObjectDirectory
                (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      detail::ComputeISPCExtraObjects
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&srcpp,psVar23,&pchSource,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ddModmapFile);
      if (srcpp._M_dataplus._M_p != (pointer)srcpp._M_string_length) {
        _Var36 = srcpp._M_dataplus;
        do {
          dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dependFileName,*(long *)_Var36._M_p,
                     *(long *)((long)_Var36._M_p + 8) + *(long *)_Var36._M_p);
          pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
          cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar22,&dependFileName);
          std::__cxx11::string::_M_assign((string *)&dependFileName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b8,
                     &dependFileName);
          pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,dependFileName._M_dataplus._M_p,
                     dependFileName._M_dataplus._M_p + dependFileName._M_string_length);
          cmGlobalNinjaGenerator::AddAdditionalCleanFile(pcVar22,&local_d0,config);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
            operator_delete(dependFileName._M_dataplus._M_p,
                            dependFileName.field_2._M_allocated_capacity + 1);
          }
          _Var36._M_p = _Var36._M_p + 0x20;
        } while (_Var36._M_p != (pointer)srcpp._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&srcpp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
        operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
      }
    }
    source_05._M_str = (char *)__dnew;
    source_05._M_len = local_3b0;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&pchSource,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_05,SHELL);
    dependFileName._M_dataplus._M_p = (pointer)&dependFileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dependFileName,"ISPC_HEADER_FILE","")
    ;
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_140,&dependFileName);
    std::__cxx11::string::operator=((string *)pmVar25,(string *)&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ddModmapFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_3a8) {
      operator_delete((void *)__dnew,local_3a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceDirectoryFlag._M_dataplus._M_p != &sourceDirectoryFlag.field_2) {
      operator_delete(sourceDirectoryFlag._M_dataplus._M_p,
                      sourceDirectoryFlag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dyndep._M_dataplus._M_p != &dyndep.field_2) {
      operator_delete(dyndep._M_dataplus._M_p,dyndep.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cmGeneratorTarget::GetGeneratedISPCHeaders
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
    sVar7 = pchSource._M_string_length;
    _Var36 = pchSource._M_dataplus;
    if (pchSource._M_dataplus._M_p != (pointer)pchSource._M_string_length) {
      MVar28.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_Var36._M_p,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )sVar7,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )_Var36._M_p,MVar28);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
                 local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,pchSource._M_dataplus._M_p,
                 pchSource._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pchSource);
  }
  iVar20 = std::__cxx11::string::compare((char *)&language);
  if (iVar20 == 0) {
    EmitSwiftDependencyInfo(this,source,config);
  }
  else {
    pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar30 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    iVar20 = (*(pcVar30->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[0x41])(pcVar30,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar22,(ostream *)CONCAT44(extraout_var_00,iVar20),(cmNinjaBuild *)local_210,-uVar34
               ,(bool *)0x0);
  }
  pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pchSource,"OBJECT_OUTPUTS","");
  cVar24 = cmSourceFile::GetProperty(source,&pchSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
    operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
  }
  if (cVar24.Value != (string *)0x0) {
    pcVar4 = ((cVar24.Value)->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar4,pcVar4 + (cVar24.Value)->_M_string_length);
    pchSource._M_string_length = 0;
    pchSource.field_2._M_allocated_capacity =
         pchSource.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    cmGeneratorExpression::Evaluate
              (&dependFileName,&local_f0,(cmLocalGenerator *)this->LocalGenerator,config,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,&pchSource);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pchSource._M_dataplus._M_p != &pchSource.field_2) {
      operator_delete(pchSource._M_dataplus._M_p,pchSource.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (dependFileName._M_string_length != 0) {
      local_230 = local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"phony","");
      pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
      pchSource._M_string_length = 0;
      pchSource.field_2._M_allocated_capacity =
           pchSource.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_228 = 0;
      local_220[0] = 0;
      p_Var3 = &local_458._M_t._M_impl.super__Rb_tree_header;
      local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_230 = local_220;
      memset(&local_4e8,0,0x90);
      local_458._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_428._M_p = (pointer)&local_418;
      local_420 = 0;
      local_418._M_local_buf[0] = '\0';
      local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      std::__cxx11::string::_M_replace((ulong)&pchSource,0,(char *)0x0,0x7820a1);
      arg_00._M_str = dependFileName._M_dataplus._M_p;
      arg_00._M_len = dependFileName._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&sourceDirectoryFlag,arg_00,false);
      dyndep.field_2._M_allocated_capacity =
           (size_type)
           local_4e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      dyndep._M_string_length =
           (size_type)
           local_4e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      dyndep._M_dataplus._M_p =
           (pointer)local_4e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)sourceDirectoryFlag.field_2._M_allocated_capacity;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)sourceDirectoryFlag._M_dataplus._M_p;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)sourceDirectoryFlag._M_string_length;
      sourceDirectoryFlag._M_dataplus._M_p = (pointer)0x0;
      sourceDirectoryFlag._M_string_length = 0;
      sourceDirectoryFlag.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dyndep);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sourceDirectoryFlag);
      pbVar35 = local_4e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar10 = local_4e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      MVar28.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar10,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar35,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar10,MVar28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_4a0,&local_1d0);
      pcVar22 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      pcVar30 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar20 = (*(pcVar30->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[0x41])(pcVar30,fileConfig);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar22,(ostream *)CONCAT44(extraout_var_01,iVar20),(cmNinjaBuild *)&pchSource,0,
                 (bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&pchSource);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dependFileName._M_dataplus._M_p != &dependFileName.field_2) {
      operator_delete(dependFileName._M_dataplus._M_p,
                      dependFileName.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)modmapFormat._M_dataplus._M_p != &modmapFormat.field_2) {
    operator_delete(modmapFormat._M_dataplus._M_p,
                    CONCAT71(modmapFormat.field_2._M_allocated_capacity._1_7_,
                             modmapFormat.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pchSources._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&architectures);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depList);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeLinkVar._M_dataplus._M_p != &cmakeLinkVar.field_2) {
    operator_delete(cmakeLinkVar._M_dataplus._M_p,cmakeLinkVar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeVarLang._M_dataplus._M_p != &cmakeVarLang.field_2) {
    operator_delete(cmakeVarLang._M_dataplus._M_p,cmakeVarLang.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileDir._M_dataplus._M_p != &objectFileDir.field_2) {
    operator_delete(objectFileDir._M_dataplus._M_p,objectFileDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileName._M_dataplus._M_p != &objectFileName.field_2) {
    operator_delete(objectFileName._M_dataplus._M_p,objectFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceFilePath._M_dataplus._M_p != &sourceFilePath.field_2) {
    operator_delete(sourceFilePath._M_dataplus._M_p,sourceFilePath.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source, const std::string& config,
  const std::string& fileConfig, bool firstForConfig)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFilePath = this->GetCompiledSourceNinjaPath(source);
  std::string const objectDir = this->ConvertToNinjaPath(
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             this->GetGlobalGenerator()->ConfigDirectory(config)));
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  std::string cmakeVarLang = cmStrCat("CMAKE_", language);

  // build response file name
  std::string cmakeLinkVar = cmStrCat(cmakeVarLang, "_RESPONSE_FILE_FLAG");

  cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

  bool const lang_supports_response =
    !(language == "RC" || (language == "CUDA" && !flag));
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaBuild objBuild(this->LanguageCompilerRule(language, config));
  cmNinjaVars& vars = objBuild.Variables;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language, config);
  vars["DEFINES"] = this->ComputeDefines(source, language, config);
  vars["INCLUDES"] = this->ComputeIncludes(source, language, config);

  if (this->GetMakefile()->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_DEPFILE_FORMAT")) != "msvc"_s) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar =
        cmStrCat("CMAKE_", language, "_DEPFILE_EXTENSION_REPLACE");
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmStrCat(objectFileName, ".d"), cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName = cmStrCat(
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName), ".d");
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmStrCat(objectFileDir, '/', dependFileName),
        cmOutputConverter::SHELL);
    }
  }

  if (firstForConfig) {
    this->ExportObjectCompileCommand(
      language, sourceFilePath, objectDir, objectFileName, objectFileDir,
      vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"], config);
  }

  objBuild.Outputs.push_back(objectFileName);
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      // Add this object to the list of object files.
      this->Configs[config].Objects.push_back(objectFileName);
    }
  }

  objBuild.ExplicitDeps.push_back(sourceFilePath);

  // Add precompile headers dependencies
  std::vector<std::string> depList;

  std::vector<std::string> architectures;
  this->GeneratorTarget->GetAppleArchs(config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::unordered_set<std::string> pchSources;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);

    if (!pchSource.empty()) {
      pchSources.insert(pchSource);
    }
  }

  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    for (const std::string& arch : architectures) {
      depList.push_back(
        this->GeneratorTarget->GetPchHeader(config, language, arch));
      if (pchSources.find(source->GetFullPath()) == pchSources.end()) {
        depList.push_back(
          this->GeneratorTarget->GetPchFile(config, language, arch));
      }
    }
  }

  if (cmValue objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> objDepList = cmExpandedList(*objectDeps);
    std::copy(objDepList.begin(), objDepList.end(),
              std::back_inserter(depList));
  }

  if (!depList.empty()) {
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(objBuild.ImplicitDeps),
                   this->MapToNinjaPath());
  }

  objBuild.OrderOnlyDeps.push_back(this->OrderDependsTargetForTarget(config));

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFilePath)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(
      sourceFilePath, objBuild.OrderOnlyDeps);
  }

  // For some cases we scan to dynamically discover dependencies.
  bool const needDyndep = this->NeedDyndep(language, config);
  bool const compilationPreprocesses =
    !this->NeedExplicitPreprocessing(language);

  std::string modmapFormat;
  if (needDyndep) {
    std::string const modmapFormatVar =
      cmStrCat("CMAKE_EXPERIMENTAL_", language, "_MODULE_MAP_FORMAT");
    modmapFormat = this->Makefile->GetSafeDefinition(modmapFormatVar);
  }

  if (needDyndep) {
    // If source/target has preprocessing turned off, we still need to
    // generate an explicit dependency step
    const auto srcpp = source->GetSafeProperty("Fortran_PREPROCESS");
    cmOutputConverter::FortranPreprocess preprocess =
      cmOutputConverter::GetFortranPreprocess(srcpp);
    if (preprocess == cmOutputConverter::FortranPreprocess::Unset) {
      const auto& tgtpp =
        this->GeneratorTarget->GetSafeProperty("Fortran_PREPROCESS");
      preprocess = cmOutputConverter::GetFortranPreprocess(tgtpp);
    }

    bool const compilePP = !compilationPreprocesses &&
      (preprocess != cmOutputConverter::FortranPreprocess::NotNeeded);
    bool const compilePPWithDefines =
      compilePP && this->CompileWithDefines(language);

    std::string scanRuleName;
    std::string ppFileName;
    if (compilePP) {
      scanRuleName = this->LanguagePreprocessAndScanRule(language, config);
      ppFileName = this->ConvertToNinjaPath(
        this->GetPreprocessedFilePath(source, config));
    } else {
      scanRuleName = this->LanguageScanRule(language, config);
      ppFileName = cmStrCat(objectFileName, ".ddi.i");
    }

    cmNinjaBuild ppBuild = GetScanBuildStatement(
      scanRuleName, ppFileName, compilePP, compilePPWithDefines, objBuild,
      vars, modmapFormat, objectFileName, this->LocalGenerator);

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const& postFlag = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_POSTPROCESS_FLAG"));
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);

      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, config, false);

      vars["INCLUDES"] = cmStrCat(sourceDirectoryFlag, ' ', vars["INCLUDES"]);
    }

    if (firstForConfig) {
      std::string const ddiFile = cmStrCat(objectFileName, ".ddi");
      this->Configs[config].DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppBuild.Variables);

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           ppBuild, commandLineLengthLimit);

    std::string const dyndep = this->GetDyndepFilePath(language, config);
    objBuild.OrderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;

    if (!modmapFormat.empty()) {
      std::string const ddModmapFile = cmStrCat(objectFileName, ".modmap");
      vars["DYNDEP_MODULE_MAP_FILE"] = ddModmapFile;
      objBuild.OrderOnlyDeps.push_back(ddModmapFile);
    }
  }

  this->EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      this->addPoolNinjaVariable("JOB_POOL_PRECOMPILE_HEADER",
                                 this->GetGeneratorTarget(), vars);
    }
  }

  this->SetMsvcTargetPdbVariable(vars, config);

  objBuild.RspFile = cmStrCat(objectFileName, ".rsp");

  if (language == "ISPC") {
    std::string const& objectName =
      this->GeneratorTarget->GetObjectName(source);
    std::string ispcSource =
      cmSystemTools::GetFilenameWithoutLastExtension(objectName);
    ispcSource = cmSystemTools::GetFilenameWithoutLastExtension(ispcSource);

    cmValue ispcSuffixProp =
      this->GeneratorTarget->GetProperty("ISPC_HEADER_SUFFIX");
    assert(ispcSuffixProp);

    std::string ispcHeaderDirectory =
      this->GeneratorTarget->GetObjectDirectory(config);
    if (cmValue prop =
          this->GeneratorTarget->GetProperty("ISPC_HEADER_DIRECTORY")) {
      ispcHeaderDirectory =
        cmStrCat(this->LocalGenerator->GetBinaryDirectory(), '/', *prop);
    }

    std::string ispcHeader =
      cmStrCat(ispcHeaderDirectory, '/', ispcSource, *ispcSuffixProp);
    ispcHeader = this->ConvertToNinjaPath(ispcHeader);

    // Make sure ninja knows what command generates the header
    objBuild.ImplicitOuts.push_back(ispcHeader);

    // Make sure ninja knows how to clean the generated header
    this->GetGlobalGenerator()->AddAdditionalCleanFile(ispcHeader, config);

    auto ispcSuffixes =
      detail::ComputeISPCObjectSuffixes(this->GeneratorTarget);
    if (ispcSuffixes.size() > 1) {
      std::string rootObjectDir =
        this->GeneratorTarget->GetObjectDirectory(config);
      auto ispcSideEfffectObjects = detail::ComputeISPCExtraObjects(
        objectName, rootObjectDir, ispcSuffixes);

      for (auto sideEffect : ispcSideEfffectObjects) {
        sideEffect = this->ConvertToNinjaPath(sideEffect);
        objBuild.ImplicitOuts.emplace_back(sideEffect);
        this->GetGlobalGenerator()->AddAdditionalCleanFile(sideEffect, config);
      }
    }

    vars["ISPC_HEADER_FILE"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ispcHeader, cmOutputConverter::SHELL);
  } else {
    auto headers = this->GeneratorTarget->GetGeneratedISPCHeaders(config);
    if (!headers.empty()) {
      std::transform(headers.begin(), headers.end(), headers.begin(),
                     this->MapToNinjaPath());
      objBuild.OrderOnlyDeps.insert(objBuild.OrderOnlyDeps.end(),
                                    headers.begin(), headers.end());
    }
  }

  if (language == "Swift") {
    this->EmitSwiftDependencyInfo(source, config);
  } else {
    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           objBuild, commandLineLengthLimit);
  }

  if (cmValue objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    std::string evaluatedObjectOutputs = cmGeneratorExpression::Evaluate(
      *objectOutputs, this->LocalGenerator, config);

    if (!evaluatedObjectOutputs.empty()) {
      cmNinjaBuild build("phony");
      build.Comment = "Additional output files.";
      build.Outputs = cmExpandedList(evaluatedObjectOutputs);
      std::transform(build.Outputs.begin(), build.Outputs.end(),
                     build.Outputs.begin(), this->MapToNinjaPath());
      build.ExplicitDeps = objBuild.Outputs;
      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), build);
    }
  }
}